

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int str_end_cmp(st_data_t ax,st_data_t ay)

{
  byte *pbVar1;
  int iVar2;
  byte *pbVar3;
  st_str_end_key *y;
  st_str_end_key *x;
  byte *pbVar4;
  
  pbVar3 = *(byte **)ax;
  pbVar1 = *(byte **)(ax + 8);
  pbVar4 = *(byte **)ay;
  iVar2 = 1;
  if ((long)pbVar1 - (long)pbVar3 == *(long *)(ay + 8) - (long)pbVar4) {
    if (pbVar3 < pbVar1) {
      do {
        if ((uint)*pbVar3 - (uint)*pbVar4 != 0) {
          return (uint)*pbVar3 - (uint)*pbVar4;
        }
        pbVar3 = pbVar3 + 1;
        pbVar4 = pbVar4 + 1;
      } while (pbVar3 != pbVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
str_end_cmp(st_data_t ax, st_data_t ay)
{
  st_str_end_key* x = (st_str_end_key* )ax;
  st_str_end_key* y = (st_str_end_key* )ay;
  UChar *p, *q;
  int c;

  if ((x->end - x->s) != (y->end - y->s))
    return 1;

  p = x->s;
  q = y->s;
  while (p < x->end) {
    c = (int )*p - (int )*q;
    if (c != 0) return c;

    p++; q++;
  }

  return 0;
}